

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc.cpp
# Opt level: O1

double __thiscall spatial_region::get_rand(spatial_region *this)

{
  int iVar1;
  double *pdVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  double dVar6;
  undefined1 auVar7 [16];
  
  pdVar2 = this->random;
  iVar1 = this->n_random;
  dVar6 = pdVar2[iVar1 % 0x37] - pdVar2[iVar1 + 0x1f + ((iVar1 + 0x1f) / 0x37) * -0x37];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar6;
  uVar3 = vcmpsd_avx512f(auVar7,ZEXT816(0) << 0x40,1);
  bVar4 = (bool)((byte)uVar3 & 1);
  dVar6 = (double)((ulong)bVar4 * (long)(dVar6 + 1.0) + (ulong)!bVar4 * (long)dVar6);
  pdVar2[iVar1 % 0x37] = dVar6;
  iVar5 = 0;
  if (iVar1 < 0x37) {
    iVar5 = iVar1 + 1;
  }
  this->n_random = iVar5;
  return dVar6;
}

Assistant:

double spatial_region::get_rand()
{
    // Метод Фибоначчи с запаздываниями
    double a;
    /* для неограниченного массива было бы
       a = random[n_random-55] - random[n_random-24]; */
    a = random[n_random%55] - random[(n_random+31)%55]; // 55-24=31
    if (a<0) a = a + 1;
    random[n_random%55] = a;
    n_random = n_random < 55 ? n_random + 1 : 0;
    return a;
}